

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O3

void deqp::egl::Image::initializeDepthRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GLenum GVar3;
  int iVar4;
  int ndx;
  int iVar5;
  int iVar6;
  int width;
  int height;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  PixelBufferAccess local_58;
  
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,rbo);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x18e);
  (*gl->clearDepthf)(0.0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"clearDepthf(0.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,400);
  (*gl->clear)(0x100);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"clear(GL_DEPTH_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x191);
  tcu::clearDepth((ref->super_TextureLevelPyramid).m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start,0.0);
  (*gl->enable)(0xc11);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"enable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x195);
  iVar5 = 0;
  iVar6 = 0xd;
  do {
    uVar1 = ref->m_width;
    uVar2 = ref->m_height;
    auVar7._0_4_ = (float)(int)uVar1;
    auVar7._4_4_ = (float)(int)uVar2;
    auVar7._8_8_ = 0;
    auVar7 = divps(auVar7,_DAT_01baf420);
    width = (int)((float)iVar6 * auVar7._0_4_);
    height = (int)((float)iVar6 * auVar7._4_4_);
    auVar8._0_4_ = -(uint)(width == 0);
    auVar8._4_4_ = -(uint)(width == 0);
    auVar8._8_4_ = -(uint)(height == 0);
    auVar8._12_4_ = -(uint)(height == 0);
    iVar4 = movmskpd((int)ref,auVar8);
    if (iVar4 != 0) break;
    (*gl->scissor)(0,0,width,height);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"scissor(0, 0, size.x(), size.y())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x19f);
    (*gl->clearDepthf)((float)iVar5 / 13.0);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"clearDepthf(depth)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1a0);
    (*gl->clear)(0x100);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"clear(GL_DEPTH_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1a1);
    tcu::getSubregion(&local_58,
                      (ref->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,0,width,height);
    tcu::clearDepth(&local_58,(float)iVar5 / 13.0);
    iVar5 = iVar5 + 1;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  (*gl->disable)(0xc11);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"disable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1a6);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x1a8);
  return;
}

Assistant:

void initializeDepthRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	const int NUM_STEPS = 13;

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,
												   GL_RENDERBUFFER, rbo));

	GLU_CHECK_GLW_CALL(gl, clearDepthf(0.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));
	tcu::clearDepth(ref.getLevel(0), 0.0f);

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < NUM_STEPS; ++ndx)
	{
		const float			depth	= (float)ndx / float(NUM_STEPS);
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(NUM_STEPS - ndx) * ((float)ref.getWidth() / float(NUM_STEPS))),
												 (int)((float)(NUM_STEPS - ndx) * ((float)ref.getHeight() / float(NUM_STEPS + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearDepthf(depth));
		GLU_CHECK_GLW_CALL(gl, clear(GL_DEPTH_BUFFER_BIT));

		tcu::clearDepth(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), depth);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT,
												   GL_RENDERBUFFER, 0));

}